

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sign.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  test_sign *sp;
  int ret;
  test_sign *in_stack_000000c8;
  test_sign *local_20;
  uint local_14;
  
  local_14 = 0;
  OPENSSL_init_crypto(0x4c,0);
  for (local_20 = test_signs; local_20->name != (char *)0x0; local_20 = local_20 + 1) {
    uVar1 = test_sign(in_stack_000000c8);
    local_14 = uVar1 | local_14;
  }
  if (local_14 == 0) {
    printf("\x1b[0;32m= All tests passed!\x1b[m\n");
  }
  else {
    printf("\x1b[0;31m= Some tests FAILED!\x1b[m\n");
  }
  return local_14;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    struct test_sign *sp;
    for (sp = test_signs; sp->name; sp++)
	ret |= test_sign(sp);

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}